

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O0

bool __thiscall CSocekt::Initialize_subproc(CSocekt *this)

{
  SourceFile file;
  SourceFile file_00;
  int iVar1;
  LogLevel LVar2;
  ThreadItem *pTVar3;
  LogStream *str;
  CSocekt *in_RDI;
  ThreadItem *pTimemonitor;
  ThreadItem *pRecyconn;
  ThreadItem *pSendQueue;
  int err;
  LogLevel in_stack_ffffffffffffdf98;
  int in_stack_ffffffffffffdf9c;
  Logger *in_stack_ffffffffffffdfa0;
  Logger *this_00;
  char (*in_stack_ffffffffffffdfa8) [100];
  SourceFile *in_stack_ffffffffffffdfb0;
  SourceFile *this_01;
  Logger *in_stack_ffffffffffffdfd0;
  vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *this_02;
  Logger local_1ff8;
  ThreadItem *local_1020;
  ThreadItem *local_1018;
  ThreadItem *local_1010;
  int local_1008;
  Logger local_fe8;
  bool local_1;
  
  iVar1 = sem_init((sem_t *)&in_RDI->m_semEventSendQueue,0,0);
  if (iVar1 == -1) {
    LVar2 = muduo::Logger::logLevel();
    if ((int)LVar2 < 3) {
      muduo::Logger::SourceFile::SourceFile<100>
                (in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfa8);
      file._8_8_ = in_stack_ffffffffffffdfb0;
      file.data_ = *in_stack_ffffffffffffdfa8;
      muduo::Logger::Logger(in_stack_ffffffffffffdfa0,file,in_stack_ffffffffffffdf9c);
      muduo::Logger::stream(&local_fe8);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffffdfb0,*in_stack_ffffffffffffdfa8);
      muduo::Logger::~Logger(in_stack_ffffffffffffdfd0);
    }
    local_1 = false;
  }
  else {
    this_02 = &in_RDI->m_threadVector;
    pTVar3 = (ThreadItem *)operator_new(0x18);
    ThreadItem::ThreadItem(pTVar3,in_RDI);
    local_1010 = pTVar3;
    std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::push_back
              ((vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *)
               in_stack_ffffffffffffdfb0,(value_type *)in_stack_ffffffffffffdfa8);
    local_1008 = pthread_create(&local_1010->_Handle,(pthread_attr_t *)0x0,ServerSendQueueThread,
                                local_1010);
    if (local_1008 == 0) {
      pTVar3 = (ThreadItem *)operator_new(0x18);
      ThreadItem::ThreadItem(pTVar3,in_RDI);
      local_1018 = pTVar3;
      std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::push_back
                ((vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *)
                 in_stack_ffffffffffffdfb0,(value_type *)in_stack_ffffffffffffdfa8);
      local_1008 = pthread_create(&local_1018->_Handle,(pthread_attr_t *)0x0,
                                  ServerRecyConnectionThread,local_1018);
      if (local_1008 == 0) {
        if (in_RDI->m_ifkickTimeCount == 1) {
          this_01 = (SourceFile *)&in_RDI->m_threadVector;
          pTVar3 = (ThreadItem *)operator_new(0x18);
          ThreadItem::ThreadItem(pTVar3,in_RDI);
          local_1020 = pTVar3;
          std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::push_back
                    ((vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *)
                     this_01,(value_type *)in_stack_ffffffffffffdfa8);
          local_1008 = pthread_create(&local_1020->_Handle,(pthread_attr_t *)0x0,
                                      ServerTimerQueueMonitorThread,local_1020);
          if (local_1008 != 0) {
            muduo::Logger::SourceFile::SourceFile<100>(this_01,in_stack_ffffffffffffdfa8);
            this_00 = &local_1ff8;
            file_00._8_8_ = this_01;
            file_00.data_ = *in_stack_ffffffffffffdfa8;
            muduo::Logger::Logger
                      (this_00,file_00,in_stack_ffffffffffffdf9c,in_stack_ffffffffffffdf98);
            str = muduo::Logger::stream(this_00);
            muduo::LogStream::operator<<((LogStream *)this_01,(char *)str);
            muduo::Logger::~Logger((Logger *)this_02);
            return false;
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CSocekt::Initialize_subproc()
{
     //互斥量的初始化已经写成互斥类MutexLock的构造函数里面了
   
    //初始化发消息相关信号量，信号量用于进程/线程 之间的同步，虽然 互斥量[pthread_mutex_lock]和 条件变量[pthread_cond_wait]都是线程之间的同步手段，但
    //这里用信号量实现 则 更容易理解，更容易简化问题，使用书写的代码短小且清晰；
    //第二个参数=0，表示信号量在线程之间共享，确实如此 ，如果非0，表示在进程之间共享
    //第三个参数=0，表示信号量的初始值，为0时，调用sem_wait()就会卡在那里卡着
    if(sem_init(&m_semEventSendQueue,0,0) == -1)
    {
        //ngx_log_stderr(0,"CSocekt::Initialize()中sem_init(&m_semEventSendQueue,0,0)失败.");
        LOG_INFO << "CSocekt::Initialize()中sem_init(&m_semEventSendQueue,0,0)失败.";
        return false;
    }

    //创建线程
    int err;
    ThreadItem *pSendQueue;    //专门用来发送数据的线程
    m_threadVector.push_back(pSendQueue = new ThreadItem(this));                         //创建 一个新线程对象 并入到容器中 
    err = pthread_create(&pSendQueue->_Handle, NULL, ServerSendQueueThread,pSendQueue); //创建线程，错误不返回到errno，一般返回错误码
    if(err != 0)
    {
        return false;
    }

    //---
    ThreadItem *pRecyconn;    //专门用来回收连接的线程
    m_threadVector.push_back(pRecyconn = new ThreadItem(this)); 
    err = pthread_create(&pRecyconn->_Handle, NULL, ServerRecyConnectionThread,pRecyconn);
    if(err != 0)
    {
        return false;
    }

    if(m_ifkickTimeCount == 1)  //是否开启踢人时钟，1：开启   0：不开启
    {
        ThreadItem *pTimemonitor;    //专门用来处理到期不发心跳包的用户踢出的线程
        m_threadVector.push_back(pTimemonitor = new ThreadItem(this)); 
        err = pthread_create(&pTimemonitor->_Handle, NULL, ServerTimerQueueMonitorThread,pTimemonitor);
        if(err != 0)
        {
            LOG_ERROR << "CSocekt::Initialize_subproc()中pthread_create(ServerTimerQueueMonitorThread)失败.";
            return false;
        }
    }

    return true;
}